

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClass
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  int iVar1;
  long lVar2;
  Printer *this_00;
  Generator *this_01;
  long lVar3;
  
  if (*(char *)(*(long *)(desc + 0x20) + 0x6b) == '\0') {
    this_00 = printer;
    io::Printer::Print(printer,"\n");
    GenerateClassConstructor((Generator *)this_00,options,printer,desc);
    GenerateClassFieldInfo(this,options,printer,desc);
    GenerateClassToObject(this,options,printer,desc);
    GenerateClassDeserializeBinary(this,options,printer,desc);
    this_01 = this;
    GenerateClassSerializeBinary(this,options,printer,desc);
    if (0 < *(int *)(desc + 0x58)) {
      lVar3 = 0;
      lVar2 = 0;
      do {
        GenerateEnum(this_01,options,printer,(EnumDescriptor *)(*(long *)(desc + 0x60) + lVar3));
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x38;
      } while (lVar2 < *(int *)(desc + 0x58));
    }
    if (0 < *(int *)(desc + 0x48)) {
      lVar3 = 0;
      lVar2 = 0;
      do {
        GenerateClass(this,options,printer,(Descriptor *)(*(long *)(desc + 0x50) + lVar3));
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0xa8;
      } while (lVar2 < *(int *)(desc + 0x48));
    }
    GenerateClassRegistration(this,options,printer,desc);
    GenerateClassFields(this,options,printer,desc);
    if (0 < *(int *)(desc + 0x68)) {
      this = *(Generator **)(desc + 8);
      iVar1 = std::__cxx11::string::compare((char *)this);
      if (iVar1 != 0) {
        GenerateClassExtensionFieldInfo(this,options,printer,desc);
      }
    }
    if ((options->import_style != kImportClosure) && (0 < *(int *)(desc + 0x78))) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        GenerateExtension(this,options,printer,(FieldDescriptor *)(*(long *)(desc + 0x80) + lVar2));
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0xa8;
      } while (lVar3 < *(int *)(desc + 0x78));
    }
  }
  return;
}

Assistant:

void Generator::GenerateTestOnly(const GeneratorOptions& options,
                                 io::Printer* printer) const {
  if (options.testonly) {
    printer->Print("goog.setTestOnly();\n\n");
  }
  printer->Print("\n");
}